

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

int Sbd_StoComputeCutsNode(Sbd_Sto_t *p,int iObj)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  int Lev1;
  int Lev0;
  Gia_Obj_t *pObj;
  int iObj_local;
  Sbd_Sto_t *p_local;
  
  pObj_00 = Gia_ManObj(p->pGia,iObj);
  pVVar1 = p->vLevels;
  iVar2 = Gia_ObjFaninId0(pObj_00,iObj);
  iVar2 = Vec_IntEntry(pVVar1,iVar2);
  pVVar1 = p->vLevels;
  iVar3 = Gia_ObjFaninId1(pObj_00,iObj);
  iVar3 = Vec_IntEntry(pVVar1,iVar3);
  iVar2 = Abc_MaxInt(iVar2,iVar3);
  Sbd_StoComputeCutsObj(p,iObj,-1,iVar2 + 1);
  Sbd_StoMergeCuts(p,iObj);
  iVar2 = Vec_IntEntry(p->vDelays,iObj);
  return iVar2;
}

Assistant:

int Sbd_StoComputeCutsNode( Sbd_Sto_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int Lev0 = Vec_IntEntry( p->vLevels, Gia_ObjFaninId0(pObj, iObj) );
    int Lev1 = Vec_IntEntry( p->vLevels, Gia_ObjFaninId1(pObj, iObj) );
    Sbd_StoComputeCutsObj( p, iObj, -1, 1 + Abc_MaxInt(Lev0, Lev1) );
    Sbd_StoMergeCuts( p, iObj );
    return Vec_IntEntry( p->vDelays, iObj );
}